

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

size_t archive_acl_text_len
                 (archive_acl *acl,wchar_t want_type,wchar_t flags,wchar_t wide,archive_conflict *a,
                 archive_string_conv *sc)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t wVar3;
  size_t sVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  archive_acl_entry *paVar12;
  size_t len;
  wchar_t *wname;
  char *name;
  size_t local_48;
  wchar_t *local_40;
  char *local_38;
  
  paVar12 = acl->acl_head;
  if (paVar12 == (archive_acl_entry *)0x0) {
    sVar9 = 0;
    sVar10 = 0;
  }
  else {
    sVar9 = 0;
    iVar11 = 0;
    do {
      wVar3 = paVar12->type;
      if (((wVar3 & want_type) == 0) ||
         (((wVar1 = paVar12->tag, wVar3 == L'Ā' && ((uint)(wVar1 + L'\xffffd8ee') < 5)) &&
          ((0x15U >> (wVar1 + L'\xffffd8ee' & 0x1fU) & 1) != 0)))) goto LAB_00289f99;
      lVar7 = sVar9 + ((uint)(wVar3 & want_type) >> 6 & 8);
      switch(wVar1) {
      case L'✑':
      case L'✕':
switchD_00289e20_caseD_2711:
        lVar7 = lVar7 + 4;
        break;
      case L'✒':
        lVar6 = 6;
        if (want_type != L'㰀') goto switchD_00289e20_caseD_2711;
LAB_00289e54:
        lVar8 = lVar7 + lVar6 + 1;
        lVar7 = lVar7 + lVar6;
        goto LAB_00289eb5;
      case L'✔':
        lVar6 = 6;
        if (want_type == L'㰀') goto LAB_00289e54;
      case L'✓':
      case L'✖':
        lVar7 = lVar7 + 5;
        break;
      default:
        lVar6 = 9;
        if (wVar1 == L'❻') goto LAB_00289e54;
      }
      lVar8 = lVar7 + 1;
      if ((wVar1 | 2U) == 0x2713) {
        if (wide == L'\0') {
          wVar3 = archive_mstring_get_mbs_l(a,&paVar12->name,&local_38,&local_48,sc);
          if (wVar3 != L'\0') {
            return 0;
          }
          if ((local_48 == 0) || (local_38 == (char *)0x0)) goto LAB_00289f13;
          lVar8 = local_48 + lVar8;
        }
        else {
          wVar3 = archive_mstring_get_wcs(a,&paVar12->name,&local_40);
          if (local_40 == (wchar_t *)0x0 || wVar3 != L'\0') {
            if ((wVar3 < L'\0') && (piVar5 = __errno_location(), *piVar5 == 0xc)) {
              return 0;
            }
LAB_00289f13:
            lVar8 = lVar7 + 0xe;
          }
          else {
            sVar4 = wcslen(local_40);
            lVar8 = sVar4 + lVar8;
          }
        }
        lVar7 = lVar8 + 1;
      }
      else {
LAB_00289eb5:
        lVar7 = lVar7 + 2;
        if (want_type == L'㰀') {
          lVar7 = lVar8;
        }
      }
      if ((want_type & 0x300U) != 0 && (flags & 4U) != 0) {
        lVar7 = lVar7 - (ulong)((uint)(paVar12->tag + L'\xffffd8eb') < 2);
      }
      if (want_type == L'㰀') {
        lVar7 = lVar7 + 0x1b + (ulong)((paVar12->type & L'ࠀ') == L'\0');
      }
      else {
        lVar7 = lVar7 + 3;
      }
      if (((paVar12->tag | 2U) == 0x2713) && ((flags & 1U) != 0)) {
        lVar6 = 1;
        wVar3 = paVar12->id;
        if (L'\t' < paVar12->id) {
          do {
            lVar6 = lVar6 + 1;
            bVar2 = 99 < (uint)wVar3;
            wVar3 = (uint)wVar3 / 10;
          } while (bVar2);
        }
        lVar7 = lVar7 + 1 + lVar6;
      }
      iVar11 = iVar11 + 1;
      sVar9 = lVar7 + 1;
LAB_00289f99:
      paVar12 = paVar12->next;
    } while (paVar12 != (archive_acl_entry *)0x0);
    sVar10 = 0;
    if (iVar11 != 0) {
      sVar10 = sVar9;
    }
  }
  if (((uint)want_type >> 8 & 1) != 0) {
    if ((flags & 4U) == 0) {
      sVar10 = sVar9 + 0x20;
    }
    else {
      sVar10 = sVar9 + 0x1f;
    }
  }
  return sVar10;
}

Assistant:

static size_t
archive_acl_text_len(struct archive_acl *acl, int want_type, int flags,
    int wide, struct archive *a, struct archive_string_conv *sc) {
	struct archive_acl_entry *ap;
	const char *name;
	const wchar_t *wname;
	int count, idlen, tmp, r;
	size_t length;
	size_t len;

	count = 0;
	length = 0;
	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		count++;
		if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0
		    && (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0)
			length += 8; /* "default:" */
		switch (ap->tag) {
		case ARCHIVE_ENTRY_ACL_USER_OBJ:
			if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
				length += 6; /* "owner@" */
				break;
			}
			/* FALLTHROUGH */
		case ARCHIVE_ENTRY_ACL_USER:
		case ARCHIVE_ENTRY_ACL_MASK:
			length += 4; /* "user", "mask" */
			break;
		case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
			if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
				length += 6; /* "group@" */
				break;
			}
			/* FALLTHROUGH */
		case ARCHIVE_ENTRY_ACL_GROUP:
		case ARCHIVE_ENTRY_ACL_OTHER:
			length += 5; /* "group", "other" */
			break;
		case ARCHIVE_ENTRY_ACL_EVERYONE:
			length += 9; /* "everyone@" */
			break;
		}
		length += 1; /* colon after tag */
		if (ap->tag == ARCHIVE_ENTRY_ACL_USER ||
		    ap->tag == ARCHIVE_ENTRY_ACL_GROUP) {
			if (wide) {
				r = archive_mstring_get_wcs(a, &ap->name,
				    &wname);
				if (r == 0 && wname != NULL)
					length += wcslen(wname);
				else if (r < 0 && errno == ENOMEM)
					return (0);
				else
					length += sizeof(uid_t) * 3 + 1;
			} else {
				r = archive_mstring_get_mbs_l(a, &ap->name, &name,
				    &len, sc);
				if (r != 0)
					return (0);
				if (len > 0 && name != NULL)
					length += len;
				else
					length += sizeof(uid_t) * 3 + 1;
			}
			length += 1; /* colon after user or group name */
		} else if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4)
			length += 1; /* 2nd colon empty user,group or other */

		if (((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) != 0)
		    && ((want_type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_OTHER
		    || ap->tag == ARCHIVE_ENTRY_ACL_MASK)) {
			/* Solaris has no colon after other: and mask: */
			length = length - 1;
		}

		if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* rwxpdDaARWcCos:fdinSFI:deny */
			length += 27;
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DENY) == 0)
				length += 1; /* allow, alarm, audit */
		} else
			length += 3; /* rwx */

		if ((ap->tag == ARCHIVE_ENTRY_ACL_USER ||
		    ap->tag == ARCHIVE_ENTRY_ACL_GROUP) &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID) != 0) {
			length += 1; /* colon */
			/* ID digit count */
			idlen = 1;
			tmp = ap->id;
			while (tmp > 9) {
				tmp = tmp / 10;
				idlen++;
			}
			length += idlen;
		}
		length ++; /* entry separator */
	}

	/* Add filemode-mapping access entries to the length */
	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		if ((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) != 0) {
			/* "user::rwx\ngroup::rwx\nother:rwx\n" */
			length += 31;
		} else {
			/* "user::rwx\ngroup::rwx\nother::rwx\n" */
			length += 32;
		}
	} else if (count == 0)
		return (0);

	/* The terminating character is included in count */
	return (length);
}